

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

char * Abc_SopCreateNor(Mem_Flex_t *pMan,int nVars)

{
  char *pcVar1;
  
  pcVar1 = Abc_SopStart(pMan,1,nVars);
  if (0 < nVars) {
    pcVar1 = (char *)memset(pcVar1,0x30,(ulong)(uint)nVars);
    return pcVar1;
  }
  return pcVar1;
}

Assistant:

char * Abc_SopCreateNor( Mem_Flex_t * pMan, int nVars )
{
    char * pSop;
    int i;
    pSop = Abc_SopStart( pMan, 1, nVars );
    for ( i = 0; i < nVars; i++ )
        pSop[i] = '0';
    return pSop;
}